

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O2

void __thiscall
absl::strings_internal::BigUnsigned<84>::AddWithCarry
          (BigUnsigned<84> *this,int index,uint64_t value)

{
  uint32_t *puVar1;
  uint uVar2;
  int iVar3;
  uint32_t value_00;
  int iVar4;
  
  if (0x53 < index || value == 0) {
    return;
  }
  value_00 = (uint32_t)(value >> 0x20);
  puVar1 = this->words_ + index;
  uVar2 = *puVar1;
  *puVar1 = *puVar1 + (uint)value;
  if (CARRY4(uVar2,(uint)value)) {
    value_00 = value_00 + 1;
    if (value_00 == 0) {
      AddWithCarry(this,index + 2,1);
      return;
    }
  }
  else if (value >> 0x20 == 0) {
    iVar4 = index + 1;
    if (index + 1 <= this->size_) {
      iVar4 = this->size_;
    }
    iVar3 = 0x54;
    if (iVar4 < 0x54) {
      iVar3 = iVar4;
    }
    this->size_ = iVar3;
    return;
  }
  AddWithCarry(this,index + 1,value_00);
  return;
}

Assistant:

void AddWithCarry(int index, uint64_t value) {
    if (value && index < max_words) {
      uint32_t high = value >> 32;
      uint32_t low = value & 0xffffffff;
      words_[index] += low;
      if (words_[index] < low) {
        ++high;
        if (high == 0) {
          // Carry from the low word caused our high word to overflow.
          // Short circuit here to do the right thing.
          AddWithCarry(index + 2, static_cast<uint32_t>(1));
          return;
        }
      }
      if (high > 0) {
        AddWithCarry(index + 1, high);
      } else {
        // Normally 32-bit AddWithCarry() sets size_, but since we don't call
        // it when `high` is 0, do it ourselves here.
        size_ = (std::min)(max_words, (std::max)(index + 1, size_));
      }
    }
  }